

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O1

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinSCANL_X>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               const_host_buffer_type lapl,const_host_buffer_type tau,host_buffer_type eps,
               host_buffer_type vrho,host_buffer_type vsigma,host_buffer_type vlapl,
               host_buffer_type vtau)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  double vtb;
  double vta;
  double vlb;
  double vla;
  double vsbb;
  double vsab;
  double vsaa;
  double vrb;
  double vra;
  double e;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_48;
  double dStack_40;
  
  if (0 < N) {
    lVar4 = 2;
    lVar5 = 0;
    local_58 = scal_fact;
    local_48 = scal_fact;
    dStack_40 = scal_fact;
    do {
      kernel_traits<ExchCXX::Deorbitalized<ExchCXX::BuiltinSCAN_X,_ExchCXX::BuiltinPC07OPT_K>_>::
      eval_exc_vxc_polar(*(double *)((long)rho + lVar5 * 2),*(double *)((long)rho + lVar5 * 2 + 8),
                         sigma[lVar4 + -2],sigma[lVar4 + -1],sigma[lVar4],
                         *(double *)((long)lapl + lVar5 * 2),*(double *)((long)lapl + lVar5 * 2 + 8)
                         ,*(double *)((long)tau + lVar5 * 2),*(double *)((long)tau + lVar5 * 2 + 8),
                         &local_60,&local_68,&local_70,&local_78,&local_80,&local_88,&local_90,
                         &local_98,&local_a0,&local_a8);
      *(double *)((long)eps + lVar5) = local_60 * local_58 + *(double *)((long)eps + lVar5);
      pdVar1 = (double *)((long)vrho + lVar5 * 2);
      dVar3 = pdVar1[1];
      pdVar2 = (double *)((long)vrho + lVar5 * 2);
      *pdVar2 = local_68 * local_48 + *pdVar1;
      pdVar2[1] = local_70 * dStack_40 + dVar3;
      dVar3 = (vsigma + lVar4 + -2)[1];
      vsigma[lVar4 + -2] = local_78 * local_48 + vsigma[lVar4 + -2];
      (vsigma + lVar4 + -2)[1] = local_80 * dStack_40 + dVar3;
      vsigma[lVar4] = local_88 * local_58 + vsigma[lVar4];
      pdVar1 = (double *)((long)vtau + lVar5 * 2);
      dVar3 = pdVar1[1];
      pdVar2 = (double *)((long)vtau + lVar5 * 2);
      *pdVar2 = local_a0 * local_48 + *pdVar1;
      pdVar2[1] = local_a8 * dStack_40 + dVar3;
      pdVar1 = (double *)((long)vlapl + lVar5 * 2);
      dVar3 = pdVar1[1];
      pdVar2 = (double *)((long)vlapl + lVar5 * 2);
      *pdVar2 = local_90 * local_48 + *pdVar1;
      pdVar2[1] = local_98 * dStack_40 + dVar3;
      lVar4 = lVar4 + 3;
      lVar5 = lVar5 + 8;
    } while ((ulong)(uint)N << 3 != lVar5);
  }
  return;
}

Assistant:

MGGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* tau_i    = tau   + 2*i;
    auto* lapl_i   = lapl  + 2*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;
    auto* vtau_i   = vtau   + 2*i;
    auto* vlapl_i  = vlapl  + 2*i;

    const double lapl_a_use = traits::needs_laplacian ? lapl_i[0] : 0.0;
    const double lapl_b_use = traits::needs_laplacian ? lapl_i[1] : 0.0;
    double e, vra, vrb, vsaa,vsab,vsbb, vla, vlb, vta, vtb;

    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], lapl_a_use, lapl_b_use, tau_i[0], tau_i[1], 
      e, vra, vrb, vsaa, vsab, vsbb, vla, vlb, vta, vtb );

    eps[i]      += scal_fact * e;
    vrho_i[0]   += scal_fact * vra;
    vrho_i[1]   += scal_fact * vrb;
    vsigma_i[0] += scal_fact * vsaa;
    vsigma_i[1] += scal_fact * vsab;
    vsigma_i[2] += scal_fact * vsbb;
    vtau_i[0]   += scal_fact * vta;
    vtau_i[1]   += scal_fact * vtb;
    if(traits::needs_laplacian) {
      vlapl_i[0] += scal_fact * vla;
      vlapl_i[1] += scal_fact * vlb;
    }

  }

}